

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O1

void uv__process_child_init
               (uv_process_options_t *options,int stdio_count,int (*pipes) [2],int error_fd)

{
  int iVar1;
  int iVar2;
  __sighandler_t p_Var3;
  int *piVar4;
  int iVar5;
  int fd;
  ulong unaff_R12;
  int iVar6;
  sigset_t signewset;
  int local_b4;
  sigset_t local_b0;
  
  iVar5 = 1;
  do {
    iVar6 = error_fd;
    if ((iVar5 != 9) && (iVar5 != 0x13)) {
      p_Var3 = signal(iVar5,(__sighandler_t)0x0);
      if (p_Var3 == (__sighandler_t)0xffffffffffffffff) goto LAB_00133453;
    }
    iVar5 = iVar5 + 1;
  } while (iVar5 != 0x20);
  if ((options->flags & 8) != 0) {
    setsid();
  }
  if (0 < stdio_count) {
    unaff_R12 = 0;
    do {
      if ((uint)pipes[unaff_R12][1] < unaff_R12) {
        iVar5 = fcntl64((ulong)(uint)pipes[unaff_R12][1],0x406,(ulong)(uint)stdio_count);
        pipes[unaff_R12][1] = iVar5;
        if (iVar5 == -1) goto LAB_00133453;
      }
      unaff_R12 = unaff_R12 + 1;
    } while ((uint)stdio_count != unaff_R12);
  }
  iVar5 = (int)unaff_R12;
  local_b4 = error_fd;
  if (0 < stdio_count) {
    iVar5 = 0x156745;
    iVar6 = 0;
    do {
      iVar2 = pipes[iVar6][1];
      fd = -1;
      iVar1 = 0x156745;
      if (iVar2 < 0) {
        if (iVar6 < 3) {
          uv__close_nocheckstdio(iVar6);
          iVar2 = open64("/dev/null",(uint)(iVar6 != 0) * 2);
          fd = iVar2;
          if (-1 < iVar2) goto LAB_0013333e;
          goto LAB_00133464;
        }
      }
      else {
LAB_0013333e:
        if (iVar6 == iVar2) {
          if (fd == -1) {
            iVar2 = uv__cloexec(iVar2,0);
            if (iVar2 != 0) {
              uv__write_int(error_fd,iVar2);
              return;
            }
          }
        }
        else {
          iVar6 = dup2(iVar2,iVar6);
        }
        if (iVar6 == -1) goto LAB_00133464;
        if ((fd == -1) && (iVar6 < 3)) {
          uv__nonblock_fcntl(iVar6,0);
        }
        if (stdio_count <= fd) {
          uv__close(fd);
        }
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < stdio_count);
  }
  if (options->cwd == (char *)0x0) {
LAB_001333b3:
    unaff_R12 = (ulong)(uint)error_fd;
    if ((options->flags & 3) != 0) {
      piVar4 = __errno_location();
      iVar5 = *piVar4;
      setgroups(0,(__gid_t *)0x0);
      *piVar4 = iVar5;
    }
    if ((options->flags & 2) == 0) {
LAB_001333ec:
      if ((options->flags & 1) != 0) {
        iVar5 = setuid(options->uid);
        if (iVar5 != 0) goto LAB_00133476;
      }
      if (options->env != (char **)0x0) {
        _environ = options->env;
      }
      sigemptyset(&local_b0);
      iVar5 = sigprocmask(2,&local_b0,(sigset_t *)0x0);
      if (iVar5 != 0) goto LAB_00133487;
      execvp(options->file,options->args);
      piVar4 = __errno_location();
      uv__write_int(error_fd,-*piVar4);
LAB_00133453:
      piVar4 = __errno_location();
      uv__write_int(iVar6,-*piVar4);
      iVar1 = (int)unaff_R12;
      goto LAB_00133464;
    }
    iVar5 = setgid(options->gid);
    if (iVar5 == 0) goto LAB_001333ec;
  }
  else {
    iVar2 = chdir(options->cwd);
    iVar1 = iVar5;
    if (iVar2 == 0) goto LAB_001333b3;
LAB_00133464:
    error_fd = iVar1;
    piVar4 = __errno_location();
    uv__write_int(local_b4,-*piVar4);
  }
LAB_00133476:
  piVar4 = __errno_location();
  uv__write_int(error_fd,-*piVar4);
LAB_00133487:
  abort();
}

Assistant:

static void uv__process_child_init(const uv_process_options_t* options,
                                   int stdio_count,
                                   int (*pipes)[2],
                                   int error_fd) {
  sigset_t signewset;
  int close_fd;
  int use_fd;
  int fd;
  int n;

  /* Reset signal disposition first. Use a hard-coded limit because NSIG is not
   * fixed on Linux: it's either 32, 34 or 64, depending on whether RT signals
   * are enabled. We are not allowed to touch RT signal handlers, glibc uses
   * them internally.
   */
  for (n = 1; n < 32; n += 1) {
    if (n == SIGKILL || n == SIGSTOP)
      continue;  /* Can't be changed. */

#if defined(__HAIKU__)
    if (n == SIGKILLTHR)
      continue;  /* Can't be changed. */
#endif

    if (SIG_ERR != signal(n, SIG_DFL))
      continue;

    uv__write_errno(error_fd);
  }

  if (options->flags & UV_PROCESS_DETACHED)
    setsid();

  /* First duplicate low numbered fds, since it's not safe to duplicate them,
   * they could get replaced. Example: swapping stdout and stderr; without
   * this fd 2 (stderr) would be duplicated into fd 1, thus making both
   * stdout and stderr go to the same fd, which was not the intention. */
  for (fd = 0; fd < stdio_count; fd++) {
    use_fd = pipes[fd][1];
    if (use_fd < 0 || use_fd >= fd)
      continue;
#ifdef F_DUPFD_CLOEXEC /* POSIX 2008 */
    pipes[fd][1] = fcntl(use_fd, F_DUPFD_CLOEXEC, stdio_count);
#else
    pipes[fd][1] = fcntl(use_fd, F_DUPFD, stdio_count);
#endif
    if (pipes[fd][1] == -1)
      uv__write_errno(error_fd);
#ifndef F_DUPFD_CLOEXEC /* POSIX 2008 */
    n = uv__cloexec(pipes[fd][1], 1);
    if (n)
      uv__write_int(error_fd, n);
#endif
  }

  for (fd = 0; fd < stdio_count; fd++) {
    close_fd = -1;
    use_fd = pipes[fd][1];

    if (use_fd < 0) {
      if (fd >= 3)
        continue;
      else {
        /* Redirect stdin, stdout and stderr to /dev/null even if UV_IGNORE is
         * set. */
        uv__close_nocheckstdio(fd); /* Free up fd, if it happens to be open. */
        use_fd = open("/dev/null", fd == 0 ? O_RDONLY : O_RDWR);
        close_fd = use_fd;

        if (use_fd < 0)
          uv__write_errno(error_fd);
      }
    }

    if (fd == use_fd) {
      if (close_fd == -1) {
        n = uv__cloexec(use_fd, 0);
        if (n)
          uv__write_int(error_fd, n);
      }
    }
    else {
      fd = dup2(use_fd, fd);
    }

    if (fd == -1)
      uv__write_errno(error_fd);

    if (fd <= 2 && close_fd == -1)
      uv__nonblock_fcntl(fd, 0);

    if (close_fd >= stdio_count)
      uv__close(close_fd);
  }

  if (options->cwd != NULL && chdir(options->cwd))
    uv__write_errno(error_fd);

  if (options->flags & (UV_PROCESS_SETUID | UV_PROCESS_SETGID)) {
    /* When dropping privileges from root, the `setgroups` call will
     * remove any extraneous groups. If we don't call this, then
     * even though our uid has dropped, we may still have groups
     * that enable us to do super-user things. This will fail if we
     * aren't root, so don't bother checking the return value, this
     * is just done as an optimistic privilege dropping function.
     */
    SAVE_ERRNO(setgroups(0, NULL));
  }

  if ((options->flags & UV_PROCESS_SETGID) && setgid(options->gid))
    uv__write_errno(error_fd);

  if ((options->flags & UV_PROCESS_SETUID) && setuid(options->uid))
    uv__write_errno(error_fd);

  if (options->env != NULL)
    environ = options->env;

  /* Reset signal mask just before exec. */
  sigemptyset(&signewset);
  if (sigprocmask(SIG_SETMASK, &signewset, NULL) != 0)
    abort();

#ifdef __MVS__
  execvpe(options->file, options->args, environ);
#else
  execvp(options->file, options->args);
#endif

  uv__write_errno(error_fd);
}